

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstrum_power_normalization.h
# Opt level: O1

void __thiscall sptk::MelCepstrumPowerNormalization::Buffer::~Buffer(Buffer *this)

{
  ~Buffer(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Buffer() {
    }